

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_fe19af::HandleJSONCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *arguments,cmExecutionStatus *status)

{
  cmMakefile *this;
  optional<(anonymous_namespace)::Args> errorPath;
  optional<(anonymous_namespace)::Args> errorPath_00;
  optional<(anonymous_namespace)::Args> errorPath_01;
  optional<(anonymous_namespace)::Args> errorPath_02;
  optional<(anonymous_namespace)::Args> errorPath_03;
  string_view value;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  bool bVar3;
  ValueType VVar4;
  ArrayIndex AVar5;
  int __n;
  ArrayIndex AVar6;
  string *name;
  string *psVar7;
  string *psVar8;
  Value *this_00;
  Value *pVVar9;
  json_error *pjVar10;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  char *pcVar12;
  Value *extraout_RDX;
  Value *extraout_RDX_00;
  Value *extraout_RDX_01;
  Value *value_00;
  Value *extraout_RDX_02;
  Value *extraout_RDX_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_12;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_13;
  string_view error;
  string_view error_00;
  string_view error_01;
  string_view error_02;
  string_view error_03;
  string_view error_04;
  string_view error_05;
  string_view error_06;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message_03;
  string_view sVar13;
  const_iterator cVar14;
  ValueConstIterator VVar15;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view value_01;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __y_04;
  basic_string_view<char,_std::char_traits<char>_> __y_05;
  basic_string_view<char,_std::char_traits<char>_> __y_06;
  basic_string_view<char,_std::char_traits<char>_> __y_07;
  Args path;
  string_view value_02;
  basic_string_view<char,_std::char_traits<char>_> __y_08;
  Args path_00;
  basic_string_view<char,_std::char_traits<char>_> __y_09;
  Args path_01;
  string_view value_03;
  basic_string_view<char,_std::char_traits<char>_> __y_10;
  Args path_02;
  basic_string_view<char,_std::char_traits<char>_> __y_11;
  Args path_03;
  string_view value_04;
  basic_string_view<char,_std::char_traits<char>_> __y_12;
  Args path_04;
  basic_string_view<char,_std::char_traits<char>_> __y_13;
  string_view value_05;
  string_view value_06;
  Args args;
  cmAlphaNum sizeStr;
  Value json;
  undefined1 local_e0 [8];
  char *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_90;
  undefined1 local_88;
  undefined7 uStack_87;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined1 local_50;
  uint7 uStack_4f;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38;
  uint7 uStack_37;
  
  this = status->Makefile;
  args.
  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .End._M_current =
       (arguments->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  args.
  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .Begin._M_current =
       (arguments->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 1;
  sVar13._M_str = "missing out-var argument";
  sVar13._M_len = 0x18;
  name = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&args,sVar13);
  if ((args.
       super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       .Begin._M_current !=
       args.
       super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       .End._M_current) &&
     (__x._M_str = ((args.
                     super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .Begin._M_current)->_M_dataplus)._M_p,
     __x._M_len = (args.
                   super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .Begin._M_current)->_M_string_length, __y._M_str = "ERROR_VARIABLE",
     __y._M_len = 0xe, bVar3 = std::operator==(__x,__y), bVar3)) {
    (anonymous_namespace)::Args::PopFront_abi_cxx11_
              ((Args *)&args,(string_view)(ZEXT816(0x67e599) << 0x40));
    error._M_str = "missing error-var argument";
    error._M_len = 0x1a;
    psVar7 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&args,error);
    value_01._M_str = "NOTFOUND";
    value_01._M_len = 8;
    cmMakefile::AddDefinition(this,psVar7,value_01);
  }
  error_00._M_str = "missing mode argument";
  error_00._M_len = 0x15;
  psVar7 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&args,error_00);
  __x_00._M_str = (psVar7->_M_dataplus)._M_p;
  __x_00._M_len = psVar7->_M_string_length;
  __y_00._M_str = "GET";
  __y_00._M_len = 3;
  bVar3 = std::operator!=(__x_00,__y_00);
  if (((((bVar3) &&
        (__x_01._M_str = (psVar7->_M_dataplus)._M_p, __x_01._M_len = psVar7->_M_string_length,
        __y_01._M_str = "TYPE", __y_01._M_len = 4, bVar3 = std::operator!=(__x_01,__y_01), bVar3))
       && (__x_02._M_str = (psVar7->_M_dataplus)._M_p, __x_02._M_len = psVar7->_M_string_length,
          __y_02._M_str = "MEMBER", __y_02._M_len = 6, bVar3 = std::operator!=(__x_02,__y_02), bVar3
          )) && ((__x_03._M_str = (psVar7->_M_dataplus)._M_p,
                 __x_03._M_len = psVar7->_M_string_length, __y_03._M_str = "LENGTH",
                 __y_03._M_len = 6, bVar3 = std::operator!=(__x_03,__y_03), bVar3 &&
                 (__x_04._M_str = (psVar7->_M_dataplus)._M_p,
                 __x_04._M_len = psVar7->_M_string_length, __y_04._M_str = "REMOVE",
                 __y_04._M_len = 6, bVar3 = std::operator!=(__x_04,__y_04), bVar3)))) &&
     ((__x_05._M_str = (psVar7->_M_dataplus)._M_p, __x_05._M_len = psVar7->_M_string_length,
      __y_05._M_str = "SET", __y_05._M_len = 3, bVar3 = std::operator!=(__x_05,__y_05), bVar3 &&
      (__x_06._M_str = (psVar7->_M_dataplus)._M_p, __x_06._M_len = psVar7->_M_string_length,
      __y_06._M_str = "EQUAL", __y_06._M_len = 5, bVar3 = std::operator!=(__x_06,__y_06), bVar3))))
  {
    pjVar10 = (json_error *)__cxa_allocate_exception(0x28);
    sizeStr.View_._M_len = 0x15;
    sizeStr.View_._M_str = "got an invalid mode \'";
    sizeStr.Digits_._8_8_ = (psVar7->_M_dataplus)._M_p;
    sizeStr.Digits_._0_8_ = psVar7->_M_string_length;
    sizeStr.Digits_[0x10] = 'A';
    sizeStr.Digits_[0x11] = '\0';
    sizeStr.Digits_[0x12] = '\0';
    sizeStr.Digits_[0x13] = '\0';
    sizeStr.Digits_[0x14] = '\0';
    sizeStr.Digits_[0x15] = '\0';
    sizeStr.Digits_[0x16] = '\0';
    sizeStr.Digits_[0x17] = '\0';
    sizeStr.Digits_._24_8_ = anon_var_dwarf_fef80e;
    local_38 = 0;
    errorPath_01.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .End._M_current =
         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )uStack_40;
    errorPath_01.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .Begin._M_current =
         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )local_48;
    errorPath_01.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ = (ulong)uStack_37 << 8;
    message_01._M_len = 3;
    message_01._M_array = &sizeStr.View_;
    json_error::json_error(pjVar10,message_01,errorPath_01);
    __cxa_throw(pjVar10,&(anonymous_namespace)::json_error::typeinfo,
                std::runtime_error::~runtime_error);
  }
  error_01._M_str = "missing json string argument";
  error_01._M_len = 0x1c;
  psVar8 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&args,error_01);
  ReadJson(&json,psVar8);
  __x_07._M_str = (psVar7->_M_dataplus)._M_p;
  __x_07._M_len = psVar7->_M_string_length;
  __y_07._M_str = "GET";
  __y_07._M_len = 3;
  _Var11._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x664b35;
  bVar3 = std::operator==(__x_07,__y_07);
  if (bVar3) {
    path.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .End._M_current = _Var11._M_current;
    path.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .Begin._M_current =
         args.
         super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         .End._M_current;
    this_00 = ResolvePath((anon_unknown_dwarf_fe19af *)&json,
                          (Value *)args.
                                   super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   .Begin._M_current,path);
    bVar3 = Json::Value::isObject(this_00);
    pVVar9 = extraout_RDX;
    if ((bVar3) || (bVar3 = Json::Value::isArray(this_00), pVVar9 = extraout_RDX_00, bVar3)) {
      (anonymous_namespace)::WriteJson_abi_cxx11_
                ((string *)&sizeStr,(_anonymous_namespace_ *)this_00,pVVar9);
      value_02._M_str = (char *)sizeStr.View_._M_len;
      value_02._M_len = (size_t)sizeStr.View_._M_str;
      cmMakefile::AddDefinition(this,name,value_02);
    }
    else {
      bVar3 = Json::Value::isBool(this_00);
      if (bVar3) {
        bVar3 = Json::Value::asBool(this_00);
        cmMakefile::AddDefinitionBool(this,name,bVar3);
        goto LAB_00328b42;
      }
      Json::Value::asString_abi_cxx11_((String *)&sizeStr,this_00);
      value_04._M_str = (char *)sizeStr.View_._M_len;
      value_04._M_len = (size_t)sizeStr.View_._M_str;
      cmMakefile::AddDefinition(this,name,value_04);
    }
  }
  else {
    __x_08._M_str = (psVar7->_M_dataplus)._M_p;
    __x_08._M_len = psVar7->_M_string_length;
    __y_08._M_str = "TYPE";
    __y_08._M_len = 4;
    _Var11._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x66a0ee;
    bVar3 = std::operator==(__x_08,__y_08);
    if (bVar3) {
      path_00.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current = _Var11._M_current;
      path_00.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current =
           args.
           super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .End._M_current;
      pVVar9 = ResolvePath((anon_unknown_dwarf_fe19af *)&json,
                           (Value *)args.
                                    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    .Begin._M_current,path_00);
      VVar4 = Json::Value::type(pVVar9);
      sVar13 = JsonTypeToString(VVar4);
      cmMakefile::AddDefinition(this,name,sVar13);
      goto LAB_00328b42;
    }
    __x_09._M_str = (psVar7->_M_dataplus)._M_p;
    __x_09._M_len = psVar7->_M_string_length;
    __y_09._M_str = "MEMBER";
    __y_09._M_len = 6;
    pcVar12 = "MEMBER";
    bVar3 = std::operator==(__x_09,__y_09);
    if (bVar3) {
      error_02._M_str = "missing member index";
      error_02._M_len = 0x14;
      psVar7 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&args,error_02);
      _Var1 = args.
              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .End;
      _Var11 = args.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .Begin;
      path_01.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar12
      ;
      path_01.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current =
           args.
           super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .End._M_current;
      pVVar9 = ResolvePath((anon_unknown_dwarf_fe19af *)&json,
                           (Value *)args.
                                    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    .Begin._M_current,path_01);
      bVar3 = Json::Value::isObject(pVVar9);
      if (!bVar3) {
        pjVar10 = (json_error *)__cxa_allocate_exception(0x28);
        sizeStr.View_._M_len = 0x3e;
        sizeStr.View_._M_str = "MEMBER needs to be called with an element of type OBJECT, got ";
        VVar4 = Json::Value::type(pVVar9);
        sizeStr.Digits_._0_16_ = JsonTypeToString(VVar4);
        local_78 = args.
                   super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .Begin._M_current;
        pbStack_70 = args.
                     super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .End._M_current;
        local_68 = 1;
        errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._17_7_ = uStack_67;
        errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._M_engaged = true;
        errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .End._M_current =
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )args.
                 super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 .End._M_current;
        errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .Begin._M_current =
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )args.
                 super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 .Begin._M_current;
        message._M_len = 2;
        message._M_array = &sizeStr.View_;
        json_error::json_error(pjVar10,message,errorPath);
        __cxa_throw(pjVar10,&(anonymous_namespace)::json_error::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      sizeStr.View_._M_str = (char *)(_Var1._M_current + 1);
      sizeStr.View_._M_len = (size_t)_Var11._M_current;
      sizeStr.Digits_[0] = '\x01';
      AVar5 = Json::Value::size(pVVar9);
      __n = ParseIndex(psVar7,(optional<(anonymous_namespace)::Args> *)&sizeStr,AVar5);
      cVar14 = Json::Value::begin(pVVar9);
      VVar15.super_ValueIteratorBase._9_7_ = 0;
      VVar15.super_ValueIteratorBase.current_._M_node =
           (_Base_ptr)(long)cVar14.super_ValueIteratorBase._0_9_;
      VVar15.super_ValueIteratorBase.isNull_ =
           (bool)(char)(cVar14.super_ValueIteratorBase._0_9_ >> 0x40);
      VVar15 = std::next<Json::ValueConstIterator>(VVar15,__n);
      local_e0 = (undefined1  [8])VVar15.super_ValueIteratorBase.current_._M_node;
      local_d8 = (char *)CONCAT71(local_d8._1_7_,VVar15.super_ValueIteratorBase.isNull_);
      Json::ValueIteratorBase::name_abi_cxx11_((String *)&sizeStr,(ValueIteratorBase *)local_e0);
      value_03._M_str = (char *)sizeStr.View_._M_len;
      value_03._M_len = (size_t)sizeStr.View_._M_str;
      cmMakefile::AddDefinition(this,name,value_03);
    }
    else {
      __x_10._M_str = (psVar7->_M_dataplus)._M_p;
      __x_10._M_len = psVar7->_M_string_length;
      __y_10._M_str = "LENGTH";
      __y_10._M_len = 6;
      pcVar12 = "LENGTH";
      bVar3 = std::operator==(__x_10,__y_10);
      if (bVar3) {
        path_02.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .End._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar12;
        path_02.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .Begin._M_current =
             args.
             super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .End._M_current;
        pVVar9 = ResolvePath((anon_unknown_dwarf_fe19af *)&json,
                             (Value *)args.
                                      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      .Begin._M_current,path_02);
        bVar3 = Json::Value::isArray(pVVar9);
        if ((!bVar3) && (bVar3 = Json::Value::isObject(pVVar9), !bVar3)) {
          pjVar10 = (json_error *)__cxa_allocate_exception(0x28);
          sizeStr.View_._M_len = 0x47;
          sizeStr.View_._M_str =
               "LENGTH needs to be called with an element of type ARRAY or OBJECT, got ";
          VVar4 = Json::Value::type(pVVar9);
          sizeStr.Digits_._0_16_ = JsonTypeToString(VVar4);
          local_98 = args.
                     super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .Begin._M_current;
          pbStack_90 = args.
                       super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .End._M_current;
          local_88 = 1;
          errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._17_7_ = uStack_87;
          errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_engaged = true;
          errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .End._M_current =
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )args.
                   super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .End._M_current;
          errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .Begin._M_current =
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )args.
                   super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .Begin._M_current;
          message_00._M_len = 2;
          message_00._M_array = &sizeStr.View_;
          json_error::json_error(pjVar10,message_00,errorPath_00);
          __cxa_throw(pjVar10,&(anonymous_namespace)::json_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        AVar5 = Json::Value::size(pVVar9);
        cmAlphaNum::cmAlphaNum(&sizeStr,AVar5);
        value._M_str = sizeStr.View_._M_str;
        value._M_len = sizeStr.View_._M_len;
        cmMakefile::AddDefinition(this,name,value);
        goto LAB_00328b42;
      }
      __x_11._M_str = (psVar7->_M_dataplus)._M_p;
      __x_11._M_len = psVar7->_M_string_length;
      __y_11._M_str = "REMOVE";
      __y_11._M_len = 6;
      _Var11._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6592b6;
      bVar3 = std::operator==(__x_11,__y_11);
      if (!bVar3) {
        __x_12._M_str = (psVar7->_M_dataplus)._M_p;
        __x_12._M_len = psVar7->_M_string_length;
        __y_12._M_str = "SET";
        __y_12._M_len = 3;
        _Var11._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6985db;
        bVar3 = std::operator==(__x_12,__y_12);
        if (bVar3) {
          error_04._M_str = "missing new value remove";
          error_04._M_len = 0x18;
          psVar7 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&args,error_04);
          error_05._M_str = "missing member name to add";
          error_05._M_len = 0x1a;
          psVar8 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&args,error_05);
          _Var1 = args.
                  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .End;
          local_c0._M_current =
               args.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .Begin._M_current;
          path_04.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .End._M_current = _Var11._M_current;
          path_04.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .Begin._M_current =
               args.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .End._M_current;
          pVVar9 = ResolvePath((anon_unknown_dwarf_fe19af *)&json,
                               (Value *)args.
                                        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        .Begin._M_current,path_04);
          ReadJson((Value *)&sizeStr,psVar7);
          bVar3 = Json::Value::isObject(pVVar9);
          if (bVar3) {
            pVVar9 = Json::Value::operator[](pVVar9,psVar8);
            Json::Value::operator=(pVVar9,(Value *)&sizeStr);
            pVVar9 = extraout_RDX_01;
          }
          else {
            bVar3 = Json::Value::isArray(pVVar9);
            if (!bVar3) {
              pjVar10 = (json_error *)__cxa_allocate_exception(0x28);
              local_e0 = (undefined1  [8])&DAT_00000044;
              local_d8 = "SET needs to be called with an element of type OBJECT or ARRAY, got ";
              VVar4 = Json::Value::type(pVVar9);
              local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          )JsonTypeToString(VVar4);
              local_50 = 0;
              errorPath_03.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
              super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .End._M_current =
                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )uStack_58;
              errorPath_03.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
              super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .Begin._M_current =
                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )local_60;
              errorPath_03.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
              super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ =
                   (ulong)uStack_4f << 8;
              message_03._M_len = 2;
              message_03._M_array = (iterator)local_e0;
              json_error::json_error(pjVar10,message_03,errorPath_03);
              __cxa_throw(pjVar10,&(anonymous_namespace)::json_error::typeinfo,
                          std::runtime_error::~runtime_error);
            }
            local_d8 = (char *)(_Var1._M_current + 1);
            local_e0 = (undefined1  [8])local_c0._M_current;
            local_d0._M_local_buf[0] = 1;
            AVar6 = ParseIndex(psVar8,(optional<(anonymous_namespace)::Args> *)local_e0,0xffffffff);
            bVar3 = Json::Value::isValidIndex(pVVar9,AVar6);
            if (bVar3) {
              pVVar9 = Json::Value::operator[](pVVar9,AVar6);
              Json::Value::operator=(pVVar9,(Value *)&sizeStr);
              pVVar9 = extraout_RDX_02;
            }
            else {
              Json::Value::append(pVVar9,(Value *)&sizeStr);
              pVVar9 = extraout_RDX_03;
            }
          }
          (anonymous_namespace)::WriteJson_abi_cxx11_
                    ((string *)local_e0,(_anonymous_namespace_ *)&json,pVVar9);
          value_06._M_str = (char *)local_e0;
          value_06._M_len = (size_t)local_d8;
          cmMakefile::AddDefinition(this,name,value_06);
          std::__cxx11::string::~string((string *)local_e0);
        }
        else {
          __x_13._M_str = (psVar7->_M_dataplus)._M_p;
          __x_13._M_len = psVar7->_M_string_length;
          __y_13._M_str = "EQUAL";
          __y_13._M_len = 5;
          bVar3 = std::operator==(__x_13,__y_13);
          if (!bVar3) goto LAB_00328b42;
          error_06._M_str = "missing second json string argument";
          error_06._M_len = 0x23;
          psVar7 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&args,error_06);
          ReadJson((Value *)&sizeStr,psVar7);
          bVar3 = Json::Value::operator==(&json,(Value *)&sizeStr);
          cmMakefile::AddDefinitionBool(this,name,bVar3);
        }
        Json::Value::~Value((Value *)&sizeStr);
        goto LAB_00328b42;
      }
      error_03._M_str = "missing member or index to remove";
      error_03._M_len = 0x21;
      psVar7 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&args,error_03);
      _Var2 = args.
              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .End;
      _Var1 = args.
              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .Begin;
      path_03.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current = _Var11._M_current;
      path_03.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current =
           args.
           super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .End._M_current;
      pVVar9 = ResolvePath((anon_unknown_dwarf_fe19af *)&json,
                           (Value *)args.
                                    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    .Begin._M_current,path_03);
      bVar3 = Json::Value::isArray(pVVar9);
      if (bVar3) {
        sizeStr.View_._M_str = (char *)(_Var2._M_current + 1);
        sizeStr.View_._M_len = (size_t)_Var1._M_current;
        sizeStr.Digits_[0] = '\x01';
        AVar5 = Json::Value::size(pVVar9);
        AVar6 = ParseIndex(psVar7,(optional<(anonymous_namespace)::Args> *)&sizeStr,AVar5);
        Json::Value::Value((Value *)&sizeStr,nullValue);
        Json::Value::removeIndex(pVVar9,AVar6,(Value *)&sizeStr);
      }
      else {
        bVar3 = Json::Value::isObject(pVVar9);
        if (!bVar3) {
          pjVar10 = (json_error *)__cxa_allocate_exception(0x28);
          sizeStr.View_._M_len = 0x47;
          sizeStr.View_._M_str =
               "REMOVE needs to be called with an element of type ARRAY or OBJECT, got ";
          VVar4 = Json::Value::type(pVVar9);
          sizeStr.Digits_._0_16_ = JsonTypeToString(VVar4);
          local_b8 = args.
                     super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .Begin._M_current;
          pbStack_b0 = args.
                       super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .End._M_current;
          local_a8 = 1;
          errorPath_02.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._17_7_ = uStack_a7;
          errorPath_02.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_engaged = true;
          errorPath_02.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .End._M_current =
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )args.
                   super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .End._M_current;
          errorPath_02.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .Begin._M_current =
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )args.
                   super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .Begin._M_current;
          message_02._M_len = 2;
          message_02._M_array = &sizeStr.View_;
          json_error::json_error(pjVar10,message_02,errorPath_02);
          __cxa_throw(pjVar10,&(anonymous_namespace)::json_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        Json::Value::Value((Value *)&sizeStr,nullValue);
        Json::Value::removeMember(pVVar9,psVar7,(Value *)&sizeStr);
      }
      Json::Value::~Value((Value *)&sizeStr);
      (anonymous_namespace)::WriteJson_abi_cxx11_
                ((string *)&sizeStr,(_anonymous_namespace_ *)&json,value_00);
      value_05._M_str = (char *)sizeStr.View_._M_len;
      value_05._M_len = (size_t)sizeStr.View_._M_str;
      cmMakefile::AddDefinition(this,name,value_05);
    }
  }
  std::__cxx11::string::~string((string *)&sizeStr);
LAB_00328b42:
  Json::Value::~Value(&json);
  return true;
}

Assistant:

bool HandleJSONCommand(std::vector<std::string> const& arguments,
                       cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)

  auto& makefile = status.GetMakefile();
  Args args{ arguments.begin() + 1, arguments.end() };

  const std::string* errorVariable = nullptr;
  const std::string* outputVariable = nullptr;
  bool success = true;

  try {
    outputVariable = &args.PopFront("missing out-var argument"_s);

    if (!args.empty() && *args.begin() == "ERROR_VARIABLE"_s) {
      args.PopFront("");
      errorVariable = &args.PopFront("missing error-var argument"_s);
      makefile.AddDefinition(*errorVariable, "NOTFOUND"_s);
    }

    const auto& mode = args.PopFront("missing mode argument"_s);
    if (mode != "GET"_s && mode != "TYPE"_s && mode != "MEMBER"_s &&
        mode != "LENGTH"_s && mode != "REMOVE"_s && mode != "SET"_s &&
        mode != "EQUAL"_s) {
      throw json_error(
        { "got an invalid mode '"_s, mode,
          "', expected one of GET, TYPE, MEMBER, LENGTH, REMOVE, SET, "
          " EQUAL"_s });
    }

    const auto& jsonstr = args.PopFront("missing json string argument"_s);
    Json::Value json = ReadJson(jsonstr);

    if (mode == "GET"_s) {
      const auto& value = ResolvePath(json, args);
      if (value.isObject() || value.isArray()) {
        makefile.AddDefinition(*outputVariable, WriteJson(value));
      } else if (value.isBool()) {
        makefile.AddDefinitionBool(*outputVariable, value.asBool());
      } else {
        makefile.AddDefinition(*outputVariable, value.asString());
      }

    } else if (mode == "TYPE"_s) {
      const auto& value = ResolvePath(json, args);
      makefile.AddDefinition(*outputVariable, JsonTypeToString(value.type()));

    } else if (mode == "MEMBER"_s) {
      const auto& indexStr = args.PopBack("missing member index"_s);
      const auto& value = ResolvePath(json, args);
      if (!value.isObject()) {
        throw json_error({ "MEMBER needs to be called with an element of "
                           "type OBJECT, got "_s,
                           JsonTypeToString(value.type()) },
                         args);
      }
      const auto index = ParseIndex(
        indexStr, Args{ args.begin(), args.end() + 1 }, value.size());
      const auto memIt = std::next(value.begin(), index);
      makefile.AddDefinition(*outputVariable, memIt.name());

    } else if (mode == "LENGTH"_s) {
      const auto& value = ResolvePath(json, args);
      if (!value.isArray() && !value.isObject()) {
        throw json_error({ "LENGTH needs to be called with an "
                           "element of type ARRAY or OBJECT, got "_s,
                           JsonTypeToString(value.type()) },
                         args);
      }

      cmAlphaNum sizeStr{ value.size() };
      makefile.AddDefinition(*outputVariable, sizeStr.View());

    } else if (mode == "REMOVE"_s) {
      const auto& toRemove =
        args.PopBack("missing member or index to remove"_s);
      auto& value = ResolvePath(json, args);

      if (value.isArray()) {
        const auto index = ParseIndex(
          toRemove, Args{ args.begin(), args.end() + 1 }, value.size());
        Json::Value removed;
        value.removeIndex(index, &removed);

      } else if (value.isObject()) {
        Json::Value removed;
        value.removeMember(toRemove, &removed);

      } else {
        throw json_error({ "REMOVE needs to be called with an "
                           "element of type ARRAY or OBJECT, got "_s,
                           JsonTypeToString(value.type()) },
                         args);
      }
      makefile.AddDefinition(*outputVariable, WriteJson(json));

    } else if (mode == "SET"_s) {
      const auto& newValueStr = args.PopBack("missing new value remove"_s);
      const auto& toAdd = args.PopBack("missing member name to add"_s);
      auto& value = ResolvePath(json, args);

      Json::Value newValue = ReadJson(newValueStr);
      if (value.isObject()) {
        value[toAdd] = newValue;
      } else if (value.isArray()) {
        const auto index =
          ParseIndex(toAdd, Args{ args.begin(), args.end() + 1 });
        if (value.isValidIndex(index)) {
          value[static_cast<int>(index)] = newValue;
        } else {
          value.append(newValue);
        }
      } else {
        throw json_error({ "SET needs to be called with an "
                           "element of type OBJECT or ARRAY, got "_s,
                           JsonTypeToString(value.type()) });
      }

      makefile.AddDefinition(*outputVariable, WriteJson(json));

    } else if (mode == "EQUAL"_s) {
      const auto& jsonstr2 =
        args.PopFront("missing second json string argument"_s);
      Json::Value json2 = ReadJson(jsonstr2);
      makefile.AddDefinitionBool(*outputVariable, json == json2);
    }

  } catch (const json_error& e) {
    if (outputVariable && e.ErrorPath) {
      const auto errorPath = cmJoin(*e.ErrorPath, "-");
      makefile.AddDefinition(*outputVariable,
                             cmCatViews({ errorPath, "-NOTFOUND"_s }));
    } else if (outputVariable) {
      makefile.AddDefinition(*outputVariable, "NOTFOUND"_s);
    }

    if (errorVariable) {
      makefile.AddDefinition(*errorVariable, e.what());
    } else {
      status.SetError(cmCatViews({ "sub-command JSON "_s, e.what(), "."_s }));
      success = false;
    }
  }
  return success;
#else
  status.SetError(cmStrCat(arguments[0], " not available during bootstrap"_s));
  return false;
#endif
}